

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O3

void Nf_ManResetMatches(Nf_Man_t *p,int Round)

{
  word *pwVar1;
  Nf_Mat_t (*paNVar2) [2];
  undefined8 uVar3;
  Nf_Cfg_t NVar4;
  bool bVar5;
  Gia_Man_t *pGVar6;
  Nf_Obj_t *pNVar7;
  Nf_Obj_t **ppNVar8;
  uint uVar9;
  bool bVar10;
  uint uVar11;
  undefined1 *puVar12;
  int iVar13;
  undefined1 *puVar14;
  long lVar15;
  Nf_Mat_t *pNVar16;
  uint uVar17;
  word wVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  Nf_Mat_t *pM [2];
  Nf_Mat_t t;
  Nf_Obj_t *local_58;
  Nf_Mat_t (*local_50) [2];
  undefined8 local_48;
  word wStack_40;
  word local_38;
  
  pGVar6 = p->pGia;
  if (0 < pGVar6->nObjs) {
    lVar21 = 0;
    do {
      if (pGVar6->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      uVar3 = *(undefined8 *)(pGVar6->pObjs + lVar21);
      uVar11 = (uint)uVar3;
      if ((~uVar11 & 0x1fffffff) != 0 && -1 < (int)uVar11) {
        uVar9 = uVar11 & 0x1fffffff;
        if ((uVar9 == 0x1fffffff) || (uVar9 != ((uint)((ulong)uVar3 >> 0x20) & 0x1fffffff))) {
          uVar20 = 0;
          bVar5 = true;
          do {
            bVar10 = bVar5;
            pNVar7 = p->pNfObjs;
            pNVar7[lVar21].M[uVar20][1].A = 0;
            pNVar7[lVar21].M[uVar20][0].A = 0;
            uVar19 = uVar20 | lVar21 * 2;
            if ((p->vMapRefs).nSize <= (int)uVar19) goto LAB_006ff499;
            paNVar2 = pNVar7[lVar21].M + uVar20;
            pNVar16 = pNVar7[lVar21].M[uVar20] + 1;
            if ((p->vMapRefs).pArray[uVar19] == 0) {
              if (Round < 1) {
                if ((*(int *)*paNVar2 < 0) || (uVar11 = *(uint *)pNVar16, (int)uVar11 < 0)) {
                  __assert_fail("Round > 0 || (!pDc->fBest && !pAc->fBest)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                                ,0x769,"void Nf_ManResetMatches(Nf_Man_t *, int)");
                }
              }
              else {
                uVar11 = *(uint *)pNVar16;
              }
              if ((p->pPars->fAreaOnly != 0 || (Round & 1U) != 0) && ((uVar11 & 0x40000000) == 0)) {
                local_38 = (*paNVar2)[0].A;
                local_48 = *(undefined8 *)*paNVar2;
                wStack_40 = (*paNVar2)[0].D;
                (*paNVar2)[0].A = pNVar7[lVar21].M[uVar20][1].A;
                NVar4 = pNVar16->Cfg;
                wVar18 = pNVar7[lVar21].M[uVar20][1].D;
                *(undefined4 *)&((Nf_Mat_t *)((long)paNVar2 + 0))->field_0x0 =
                     *(undefined4 *)&pNVar16->field_0x0;
                ((Nf_Mat_t *)((long)paNVar2 + 0))->Cfg = NVar4;
                (*paNVar2)[0].D = wVar18;
                pNVar7[lVar21].M[uVar20][1].A = local_38;
                *(undefined8 *)pNVar16 = local_48;
                pNVar7[lVar21].M[uVar20][1].D = wStack_40;
                uVar11 = *(uint *)pNVar16;
              }
              puVar12 = &(*paNVar2)[0].field_0x3;
              *puVar12 = *puVar12 | 0x80;
              *(uint *)pNVar16 = uVar11 & 0x7fffffff;
            }
            else {
              uVar11 = *(uint *)*paNVar2;
              if (-1 < (int)(*(uint *)pNVar16 ^ uVar11)) {
                __assert_fail("pDc->fBest != pAc->fBest",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                              ,0x761,"void Nf_ManResetMatches(Nf_Man_t *, int)");
              }
              if ((int)*(uint *)pNVar16 < 0) {
                local_38 = (*paNVar2)[0].A;
                local_48 = *(undefined8 *)*paNVar2;
                wStack_40 = (*paNVar2)[0].D;
                (*paNVar2)[0].A = pNVar7[lVar21].M[uVar20][1].A;
                NVar4 = pNVar16->Cfg;
                wVar18 = pNVar7[lVar21].M[uVar20][1].D;
                *(undefined4 *)&((Nf_Mat_t *)((long)paNVar2 + 0))->field_0x0 =
                     *(undefined4 *)&pNVar16->field_0x0;
                ((Nf_Mat_t *)((long)paNVar2 + 0))->Cfg = NVar4;
                (*paNVar2)[0].D = wVar18;
                pNVar7[lVar21].M[uVar20][1].A = local_38;
                *(undefined8 *)pNVar16 = local_48;
                pNVar7[lVar21].M[uVar20][1].D = wStack_40;
                uVar11 = *(uint *)*paNVar2;
              }
              if (-1 < (int)uVar11) {
                __assert_fail("pDc->fBest",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                              ,0x764,"void Nf_ManResetMatches(Nf_Man_t *, int)");
              }
              if ((int)*(uint *)pNVar16 < 0) {
                __assert_fail("!pAc->fBest",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                              ,0x765,"void Nf_ManResetMatches(Nf_Man_t *, int)");
              }
            }
            uVar20 = 1;
            bVar5 = false;
          } while (bVar10);
          local_58 = p->pNfObjs + lVar21;
          pNVar7 = p->pNfObjs + lVar21;
          local_50 = pNVar7->M + 1;
          uVar11 = *(uint *)pNVar7->M[0];
          if ((-1 < (int)uVar11) || (uVar9 = *(uint *)*local_50, -1 < (int)uVar9)) {
            __assert_fail("pM[0]->fBest && pM[1]->fBest",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                          ,0x773,"void Nf_ManResetMatches(Nf_Man_t *, int)");
          }
          if (((uVar11 & uVar9) >> 0x1e & 1) != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                          ,0x779,"void Nf_ManResetMatches(Nf_Man_t *, int)");
          }
          if (((uVar9 | uVar11) >> 0x1e & 1) == 0) {
            ppNVar8 = &local_58;
            bVar5 = true;
            do {
              bVar10 = bVar5;
              if ((p->vCutSets).nSize <= lVar21) goto LAB_006ff499;
              uVar11 = (p->vCutSets).pArray[lVar21];
              uVar9 = (int)uVar11 >> 0x10;
              if (((int)uVar9 < 0) || ((p->vPages).nSize <= (int)uVar9)) goto LAB_006ff4b8;
              pNVar16 = (Nf_Mat_t *)*ppNVar8;
              wVar18 = Nf_ManComputeArrival
                                 (p,pNVar16,
                                  (int *)((ulong)((uVar11 & 0xffff) << 2) +
                                         (long)(p->vPages).pArray[uVar9]));
              pNVar16->D = wVar18;
              ppNVar8 = (Nf_Obj_t **)&local_50;
              bVar5 = false;
            } while (bVar10);
          }
          else {
            pNVar16 = (Nf_Mat_t *)(&local_58)[(uVar9 & 0x40000000) == 0];
            if ((pNVar16->field_0x3 & 0x40) != 0) {
              __assert_fail("!pM[c]->fCompl",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                            ,0x789,"void Nf_ManResetMatches(Nf_Man_t *, int)");
            }
            pNVar7 = (&local_58)[(uVar9 & 0x40000000) >> 0x1e];
            if ((pNVar7->M[0][0].field_0x3 & 0x40) == 0) {
              __assert_fail("pM[!c]->fCompl",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                            ,0x78a,"void Nf_ManResetMatches(Nf_Man_t *, int)");
            }
            if ((p->vCutSets).nSize <= lVar21) {
LAB_006ff499:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar11 = (p->vCutSets).pArray[lVar21];
            uVar9 = (int)uVar11 >> 0x10;
            if (((int)uVar9 < 0) || ((p->vPages).nSize <= (int)uVar9)) {
LAB_006ff4b8:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            wVar18 = Nf_ManComputeArrival
                               (p,pNVar16,
                                (int *)((ulong)((uVar11 & 0xffff) << 2) +
                                       (long)(p->vPages).pArray[uVar9]));
            pNVar16->D = wVar18;
            pNVar7->M[0][0].A = pNVar16->A;
            NVar4 = pNVar16->Cfg;
            wVar18 = pNVar16->D;
            *(undefined4 *)&pNVar7->M[0][0].field_0x0 = *(undefined4 *)&pNVar16->field_0x0;
            pNVar7->M[0][0].Cfg = NVar4;
            pNVar7->M[0][0].D = wVar18;
            pwVar1 = &pNVar7->M[0][0].D;
            *pwVar1 = *pwVar1 + p->InvDelay;
            puVar12 = &pNVar7->M[0][0].field_0x3;
            *puVar12 = *puVar12 | 0x40;
          }
        }
        else {
          iVar13 = (int)lVar21 - uVar9;
          pNVar7 = p->pNfObjs;
          uVar17 = (uVar11 >> 0x1d & 1) * 0x30;
          uVar11 = *(uint *)(&pNVar7[iVar13].M[0][0].field_0x0 + uVar17);
          uVar9 = *(uint *)(&pNVar7[iVar13].M[0][1].field_0x0 + uVar17);
          if (-1 < (int)(uVar9 ^ uVar11)) {
            __assert_fail("pD->fBest != pA->fBest",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                          ,0x586,"Nf_Mat_t *Nf_ObjMatchBest(Nf_Man_t *, int, int)");
          }
          puVar14 = (undefined1 *)0x0;
          puVar12 = &pNVar7[iVar13].M[0][0].field_0x0 + uVar17;
          if (-1 < (int)uVar11) {
            puVar12 = puVar14;
          }
          if ((int)uVar9 < 0) {
            puVar12 = &pNVar7[iVar13].M[0][1].field_0x0 + uVar17;
          }
          lVar15 = 0;
          bVar5 = true;
          do {
            bVar10 = bVar5;
            pNVar7[lVar21].M[lVar15][1].A = 0;
            pNVar7[lVar21].M[lVar15][0].A = 0;
            wVar18 = 0;
            if (!bVar10) {
              wVar18 = p->InvArea;
            }
            pNVar7[lVar21].M[lVar15][0].D = wVar18 + *(word *)(puVar12 + 8);
            iVar13 = *(int *)pNVar7[lVar21].M[lVar15];
            if (-1 < iVar13) {
              __assert_fail("pDc->fBest",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                            ,0x753,"void Nf_ManResetMatches(Nf_Man_t *, int)");
            }
            if (*(int *)(pNVar7[lVar21].M[lVar15] + 1) < 0) {
              __assert_fail("!pAc->fBest",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                            ,0x754,"void Nf_ManResetMatches(Nf_Man_t *, int)");
            }
            if (((~(byte)puVar14 | (byte)((uint)iVar13 >> 0x1e)) & 1) == 0) {
              __assert_fail("c==0 || pDc->fCompl",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                            ,0x755,"void Nf_ManResetMatches(Nf_Man_t *, int)");
            }
            lVar15 = 1;
            puVar14 = (undefined1 *)0x1;
            bVar5 = false;
          } while (bVar10);
        }
      }
      lVar21 = lVar21 + 1;
      pGVar6 = p->pGia;
    } while (lVar21 < pGVar6->nObjs);
  }
  return;
}

Assistant:

void Nf_ManResetMatches( Nf_Man_t * p, int Round )
{
    Gia_Obj_t * pObj;
    Nf_Mat_t * pDc, * pAc, * pMfan, * pM[2]; 
    word Arrival; int i, c;
    // go through matches in the topo order
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
        {
            pMfan = Nf_ObjMatchBest( p, Gia_ObjFaninId0(pObj, i), Gia_ObjFaninC0(pObj) );
            for ( c = 0; c < 2; c++ )
            {
                pDc = Nf_ObjMatchD( p, i, c );
                pAc = Nf_ObjMatchA( p, i, c );
                pDc->A = pAc->A = 0;
                pDc->D = pMfan->D + (c ? p->InvArea : 0); 
                assert( pDc->fBest );
                assert( !pAc->fBest );
                assert( c==0 || pDc->fCompl );
            }
            continue;
        }
        // select the best match for each phase
        for ( c = 0; c < 2; c++ )
        {
            pDc = Nf_ObjMatchD( p, i, c );
            pAc = Nf_ObjMatchA( p, i, c );
            pDc->A = pAc->A = 0;
            if ( Nf_ObjMapRefNum(p, i, c) )
            {
                assert( pDc->fBest != pAc->fBest );
                if ( pAc->fBest )
                    ABC_SWAP( Nf_Mat_t, *pDc, *pAc );
                assert( pDc->fBest );
                assert( !pAc->fBest );
            }
            else
            {
                assert( Round > 0 || (!pDc->fBest && !pAc->fBest) );
                if ( (p->pPars->fAreaOnly || (Round & 1)) && !pAc->fCompl )
                    ABC_SWAP( Nf_Mat_t, *pDc, *pAc );
                pDc->fBest = 1;
                pAc->fBest = 0;
            }
        }
        // consider best matches of both phases
        pM[0] = Nf_ObjMatchD( p, i, 0 );
        pM[1] = Nf_ObjMatchD( p, i, 1 );
        assert( pM[0]->fBest && pM[1]->fBest );
        // swap complemented matches
        if ( pM[0]->fCompl && pM[1]->fCompl )
        {
//            pM[0]->fCompl = pM[1]->fCompl = 0;
//            ABC_SWAP( Nf_Mat_t *, pM[0], pM[1] );
            assert( 0 );
        }
        if ( !pM[0]->fCompl && !pM[1]->fCompl )
        {
            for ( c = 0; c < 2; c++ )
            {
                Arrival = Nf_ManComputeArrival( p, pM[c], Nf_ObjCutSet(p, i) );
                //if ( Nf_ObjMapRefNum(p, i, c) )
                //    assert( Round || Arrival <= pM[c]->D );
                pM[c]->D = Arrival;
            }
        }
        else 
        {
            // consider non-complemented match
            c = !pM[1]->fCompl;
            assert( !pM[c]->fCompl );
            assert( pM[!c]->fCompl );
            Arrival = Nf_ManComputeArrival( p, pM[c], Nf_ObjCutSet(p, i) );
            //if ( Nf_ObjMapRefNum(p, i, c) )
            //    assert( Round || Arrival <= pM[c]->D );
            pM[c]->D = Arrival;
            // consider complemented match
            Arrival = pM[!c]->D;
            *pM[!c] = *pM[c];
            pM[!c]->D += p->InvDelay;
            pM[!c]->fCompl = 1;
            //if ( Nf_ObjMapRefNum(p, i, !c) )
            //    assert( Round || pM[!c]->D <= Arrival );
        }
    }
}